

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_pri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94 [25];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar8 = 0x25a;
    goto LAB_00133beb;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 0;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(5 / (long)iVar6);
  iVar12 = iVar5 * iVar6;
  if (5 < iVar12) {
    iVar9 = ((((iVar6 + 5) / iVar6) * (iVar12 + -6)) / iVar5 - iVar12) + 6;
  }
  if (iVar7 == iVar9) {
LAB_00133d30:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x272,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x273,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x274,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x275,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_98);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x276,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,5,local_94);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x277,"ref_fixture_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_94[0];
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[10],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x279,"ref_fixture_pri_grid",(ulong)uVar4,"add prism");
      return uVar4;
    }
  }
  else {
    iVar6 = (iVar6 + 5) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar12 = 6 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00133d30;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00133d30;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00133d30;
    iVar9 = (int)(4 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (4 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00133d30;
    iVar9 = (int)(5 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (5 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_00133d30;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,6);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar8 = 0x27c;
LAB_00133beb:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_pri_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 6;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_FALSE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 0.0, 1.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);
    add_that_node(4, 0.0, 1.0, 1.0);
    add_that_node(5, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}